

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

RegexMatcher *
Catch::Matchers::Matches(RegexMatcher *__return_storage_ptr__,string *regex,Choice caseSensitivity)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  pcVar2 = (regex->_M_dataplus)._M_p;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + regex->_M_string_length);
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->
                 super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super_MatcherUntypedBase.m_cachedToString.field_2;
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase._vptr_MatcherUntypedBase = (_func_int **)&PTR__RegexMatcher_0018fe50;
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_0018fe80;
  paVar1 = &(__return_storage_ptr__->m_regex).field_2;
  (__return_storage_ptr__->m_regex)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = local_30;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_regex).field_2 + 8) = uStack_28;
  }
  else {
    (__return_storage_ptr__->m_regex)._M_dataplus._M_p = (pointer)local_40;
    (__return_storage_ptr__->m_regex).field_2._M_allocated_capacity = local_30;
  }
  (__return_storage_ptr__->m_regex)._M_string_length = local_38;
  __return_storage_ptr__->m_caseSensitivity = caseSensitivity;
  return __return_storage_ptr__;
}

Assistant:

StdString::RegexMatcher Matches(std::string const& regex, CaseSensitive::Choice caseSensitivity) {
        return StdString::RegexMatcher(regex, caseSensitivity);
    }